

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Nes_Apu.cpp
# Opt level: O0

void __thiscall Nes_Apu::end_frame(Nes_Apu *this,cpu_time_t end_time)

{
  long in_RSI;
  long in_RDI;
  Nes_Apu *unaff_retaddr;
  
  if (*(long *)(in_RDI + 0x1400) < in_RSI) {
    run_until(unaff_retaddr,in_RDI);
  }
  *(long *)(in_RDI + 0x1400) = *(long *)(in_RDI + 0x1400) - in_RSI;
  if (*(long *)(in_RDI + 0x1400) < 0) {
    __assert_fail("( \"unmet requirement\", last_time >= 0 )",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/fgssfgss[P]NESEmulator/apu_emu/nes_apu/Nes_Apu.cpp"
                  ,0xd2,"void Nes_Apu::end_frame(cpu_time_t)");
  }
  if ((*(long *)(in_RDI + 0x1410) != 0x4000000000000000) &&
     (*(long *)(in_RDI + 0x1410) = *(long *)(in_RDI + 0x1410) - in_RSI,
     *(long *)(in_RDI + 0x1410) < 0)) {
    __assert_fail("next_irq >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/fgssfgss[P]NESEmulator/apu_emu/nes_apu/Nes_Apu.cpp"
                  ,0xd6,"void Nes_Apu::end_frame(cpu_time_t)");
  }
  if ((*(long *)(in_RDI + 0xe78) != 0x4000000000000000) &&
     (*(long *)(in_RDI + 0xe78) = *(long *)(in_RDI + 0xe78) - in_RSI, *(long *)(in_RDI + 0xe78) < 0)
     ) {
    __assert_fail("dmc.next_irq >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/fgssfgss[P]NESEmulator/apu_emu/nes_apu/Nes_Apu.cpp"
                  ,0xda,"void Nes_Apu::end_frame(cpu_time_t)");
  }
  if ((*(long *)(in_RDI + 0x1408) != 0x4000000000000000) &&
     (*(long *)(in_RDI + 0x1408) = *(long *)(in_RDI + 0x1408) - in_RSI,
     *(long *)(in_RDI + 0x1408) < 0)) {
    *(undefined8 *)(in_RDI + 0x1408) = 0;
  }
  return;
}

Assistant:

void Nes_Apu::end_frame( cpu_time_t end_time )
{
	if ( end_time > last_time )
		run_until( end_time );
	
	// make times relative to new frame
	last_time -= end_time;
	require( last_time >= 0 );
	
	if ( next_irq != no_irq ) {
		next_irq -= end_time;
		assert( next_irq >= 0 );
	}
	if ( dmc.next_irq != no_irq ) {
		dmc.next_irq -= end_time;
		assert( dmc.next_irq >= 0 );
	}
	if ( earliest_irq_ != no_irq ) {
		earliest_irq_ -= end_time;
		if ( earliest_irq_ < 0 )
			earliest_irq_ = 0;
	}
}